

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetOption
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *optionName,void *value)

{
  int iVar1;
  IOTHUB_CLIENT_RESULT IVar2;
  LOGGER_LOG p_Var3;
  STRING_HANDLE pSVar4;
  char *pcVar5;
  PLATFORM_INFO_OPTION supportedPlatformInfo;
  PLATFORM_INFO_OPTION local_2c;
  
  if ((optionName == (char *)0x0 || iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
      value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar5 = "invalid argument (NULL)";
    IVar2 = IOTHUB_CLIENT_INVALID_ARG;
    iVar1 = 0x8f7;
  }
  else {
    iVar1 = strcmp(optionName,"messageTimeout");
    if (iVar1 == 0) {
      iotHubClientHandle->currentMessageTimeout = *value;
      return IOTHUB_CLIENT_OK;
    }
    iVar1 = strcmp(optionName,"product_info");
    if (iVar1 == 0) {
      if (iotHubClientHandle->product_info != (STRING_HANDLE)0x0) {
        STRING_delete(iotHubClientHandle->product_info);
        iotHubClientHandle->product_info = (STRING_HANDLE)0x0;
      }
      iVar1 = (*iotHubClientHandle->IoTHubTransport_GetSupportedPlatformInfo)
                        (iotHubClientHandle->transportHandle,&local_2c);
      if (iVar1 == 0) {
        pSVar4 = make_product_info((char *)value,local_2c);
        iotHubClientHandle->product_info = pSVar4;
        if (pSVar4 != (STRING_HANDLE)0x0) {
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar2 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = "STRING_construct_sprintf failed";
        iVar1 = 0x913;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        IVar2 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = "IoTHubTransport_GetSupportedPlatformInfo failed";
        iVar1 = 0x90e;
      }
    }
    else {
      iVar1 = strcmp(optionName,"diag_sampling_percentage");
      if (iVar1 == 0) {
        if (*value < 0x65) {
          (iotHubClientHandle->diagnostic_setting).diagSamplingPercentage = *value;
          (iotHubClientHandle->diagnostic_setting).currentMessageNumber = 0;
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar2 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = "The value of diag_sampling_percentage is out of range [0, 100]: %u";
        iVar1 = 0x920;
      }
      else {
        iVar1 = strcmp(optionName,"blob_upload_timeout_secs");
        if ((((iVar1 == 0) || (iVar1 = strcmp(optionName,"CURLOPT_VERBOSE"), iVar1 == 0)) ||
            (iVar1 = strcmp(optionName,"network_interface_upload_to_blob"), iVar1 == 0)) ||
           (iVar1 = strcmp(optionName,"blob_upload_tls_renegotiation"), iVar1 == 0)) {
          IVar2 = IoTHubClient_LL_UploadToBlob_SetOption
                            (iotHubClientHandle->uploadToBlobHandle,optionName,value);
          if (IVar2 == IOTHUB_CLIENT_OK) {
            return IOTHUB_CLIENT_OK;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IVar2;
          }
          pcVar5 = "unable to IoTHubClientCore_LL_UploadToBlob_SetOption, result=%d";
          iVar1 = 0x934;
        }
        else {
          iVar1 = strcmp(optionName,"sas_token_refresh_time");
          if ((iVar1 == 0) || (iVar1 = strcmp(optionName,"sas_token_lifetime"), iVar1 == 0)) {
            iVar1 = IoTHubClient_Auth_Set_SasToken_Expiry
                              (iotHubClientHandle->authorization_module,*value);
            if (iVar1 == 0) {
              return IOTHUB_CLIENT_OK;
            }
            p_Var3 = xlogging_get_log_function();
            IVar2 = IOTHUB_CLIENT_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return IOTHUB_CLIENT_ERROR;
            }
            pcVar5 = "Failed setting the Token Expiry time";
            iVar1 = 0x942;
          }
          else {
            iVar1 = strcmp(optionName,"model_id");
            if (iVar1 == 0) {
              if (iotHubClientHandle->model_id == (STRING_HANDLE)0x0) {
                pSVar4 = STRING_construct((char *)value);
                iotHubClientHandle->model_id = pSVar4;
                if (pSVar4 != (STRING_HANDLE)0x0) {
                  return IOTHUB_CLIENT_OK;
                }
                p_Var3 = xlogging_get_log_function();
                IVar2 = IOTHUB_CLIENT_ERROR;
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return IOTHUB_CLIENT_ERROR;
                }
                pcVar5 = "STRING_construct failed";
                iVar1 = 0x953;
              }
              else {
                p_Var3 = xlogging_get_log_function();
                IVar2 = IOTHUB_CLIENT_ERROR;
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return IOTHUB_CLIENT_ERROR;
                }
                pcVar5 = "DT ModelId already specified.";
                iVar1 = 0x94e;
              }
            }
            else {
              IVar2 = (*iotHubClientHandle->IoTHubTransport_SetOption)
                                (iotHubClientHandle->transportHandle,optionName,value);
              if (IVar2 == IOTHUB_CLIENT_OK) {
                IoTHubClient_LL_UploadToBlob_SetOption
                          (iotHubClientHandle->uploadToBlobHandle,optionName,value);
                return IOTHUB_CLIENT_OK;
              }
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return IVar2;
              }
              pcVar5 = "unable to IoTHubTransport_SetOption";
              iVar1 = 0x963;
            }
          }
        }
      }
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_SetOption",iVar1,1,pcVar5);
  return IVar2;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetOption(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* optionName, const void* value)
{

    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("invalid argument (NULL)");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

        if (strcmp(optionName, OPTION_MESSAGE_TIMEOUT) == 0)
        {
            /*this is an option handled by IoTHubClientCore_LL*/
            handleData->currentMessageTimeout = *(const tickcounter_ms_t*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(optionName, OPTION_PRODUCT_INFO) == 0)
        {
            if (handleData->product_info != NULL)
            {
                STRING_delete(handleData->product_info);
                handleData->product_info = NULL;
            }

            PLATFORM_INFO_OPTION supportedPlatformInfo;
            if (handleData->IoTHubTransport_GetSupportedPlatformInfo(handleData->transportHandle, &supportedPlatformInfo) != 0)
            {
                LogError("IoTHubTransport_GetSupportedPlatformInfo failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if ((handleData->product_info = make_product_info((const char*)value, supportedPlatformInfo)) == NULL)
            {
                LogError("STRING_construct_sprintf failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(optionName, OPTION_DIAGNOSTIC_SAMPLING_PERCENTAGE) == 0)
        {
            uint32_t percentage = *(uint32_t*)value;
            if (percentage > 100)
            {
                LogError("The value of diag_sampling_percentage is out of range [0, 100]: %u", percentage);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                handleData->diagnostic_setting.diagSamplingPercentage = percentage;
                handleData->diagnostic_setting.currentMessageNumber = 0;
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if ((strcmp(optionName, OPTION_BLOB_UPLOAD_TIMEOUT_SECS) == 0) || 
                 (strcmp(optionName, OPTION_CURL_VERBOSE) == 0) || 
                 (strcmp(optionName, OPTION_NETWORK_INTERFACE_UPLOAD_TO_BLOB) == 0) ||
                 (strcmp(optionName, OPTION_BLOB_UPLOAD_TLS_RENEGOTIATION) == 0))
        {
#ifndef DONT_USE_UPLOADTOBLOB
            // This option just gets passed down into IoTHubClientCore_LL_UploadToBlob
            result = IoTHubClient_LL_UploadToBlob_SetOption(handleData->uploadToBlobHandle, optionName, value);
            if(result != IOTHUB_CLIENT_OK)
            {
                LogError("unable to IoTHubClientCore_LL_UploadToBlob_SetOption, result=%d", result);
            }
#else
            LogError("%s option being set with DONT_USE_UPLOADTOBLOB compiler switch", optionName);
            result = IOTHUB_CLIENT_ERROR;
#endif /*DONT_USE_UPLOADTOBLOB*/
        }
        // OPTION_SAS_TOKEN_REFRESH_TIME is, but may be updated in the future
        // if this becomes necessary
        else if (strcmp(optionName, OPTION_SAS_TOKEN_REFRESH_TIME) == 0 || strcmp(optionName, OPTION_SAS_TOKEN_LIFETIME) == 0)
        {
            // API compat: while IoTHubClient_Auth_Set_SasToken_Expiry accepts uint64_t, we cannot change the public API.
            if (IoTHubClient_Auth_Set_SasToken_Expiry(handleData->authorization_module, (uint64_t)(*(size_t*)value)) != 0)
            {
                LogError("Failed setting the Token Expiry time");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(optionName, OPTION_MODEL_ID) == 0)
        {
            if (handleData->model_id != NULL)
            {
                LogError("DT ModelId already specified.");
                result = IOTHUB_CLIENT_ERROR;
            } 
            else if ((handleData->model_id = STRING_construct((const char*)value)) == NULL)
            {
                LogError("STRING_construct failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else
        {
            // This section is unusual for SetOption calls because it attempts to pass unhandled options
            // to two downstream targets (IoTHubTransport_SetOption and IoTHubClientCore_LL_UploadToBlob_SetOption) instead of one.

            result = handleData->IoTHubTransport_SetOption(handleData->transportHandle, optionName, value);
            if(result != IOTHUB_CLIENT_OK)
            {
                LogError("unable to IoTHubTransport_SetOption");
            }
#ifndef DONT_USE_UPLOADTOBLOB
            else
            {
                (void)IoTHubClient_LL_UploadToBlob_SetOption(handleData->uploadToBlobHandle, optionName, value);
            }
#endif /*DONT_USE_UPLOADTOBLOB*/
        }
    }
    return result;
}